

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void update_rhythm_mode(EOPLL *opll)

{
  byte bVar1;
  uint uVar2;
  EOPLL_PATCH *pEVar3;
  bool bVar4;
  
  if ((opll->patch_number[6] & 0x10) == 0) {
    if ((opll->reg[0xe] & 0x20) != 0) {
      opll->patch_number[6] = '\x10';
      opll->slot[0xc].eg_mode = 7;
      opll->slot[0xd].eg_mode = 7;
      opll->slot[0xc].patch = opll->patch + 0x20;
      pEVar3 = opll->patch + 0x21;
LAB_0012d0ae:
      opll->slot[0xd].patch = pEVar3;
    }
  }
  else if ((opll->reg[0xe] & 0x20) == 0 && opll->slot_on_flag[0xd] == '\0') {
    opll->slot[0xc].eg_mode = 7;
    opll->slot[0xd].eg_mode = 7;
    bVar1 = opll->reg[0x36] >> 4;
    opll->patch_number[6] = bVar1;
    uVar2 = (uint)bVar1 * 2;
    opll->slot[0xc].patch = opll->patch + uVar2;
    pEVar3 = opll->patch + (byte)((char)uVar2 + 1);
    goto LAB_0012d0ae;
  }
  if ((opll->patch_number[7] & 0x10) == 0) {
    if ((opll->reg[0xe] & 0x20) == 0) goto LAB_0012d18b;
    opll->patch_number[7] = '\x11';
    opll->slot[0xe].type = '\x01';
    opll->slot[0xe].eg_mode = 7;
    opll->slot[0xf].eg_mode = 7;
    opll->slot[0xe].patch = opll->patch + 0x22;
    pEVar3 = opll->patch + 0x23;
  }
  else {
    if (opll->slot_on_flag[0xe] == '\0') {
      bVar4 = false;
    }
    else {
      bVar4 = opll->slot_on_flag[0xf] != '\0';
    }
    if ((opll->reg[0xe] & 0x20) != 0 || bVar4) goto LAB_0012d18b;
    opll->slot[0xe].type = '\0';
    opll->slot[0xe].eg_mode = 7;
    opll->slot[0xf].eg_mode = 7;
    bVar1 = opll->reg[0x37] >> 4;
    opll->patch_number[7] = bVar1;
    uVar2 = (uint)bVar1 * 2;
    opll->slot[0xe].patch = opll->patch + uVar2;
    pEVar3 = opll->patch + (byte)((char)uVar2 + 1);
  }
  opll->slot[0xf].patch = pEVar3;
LAB_0012d18b:
  if ((opll->patch_number[8] & 0x10) == 0) {
    if ((opll->reg[0xe] & 0x20) == 0) {
      return;
    }
    opll->patch_number[8] = '\x12';
    opll->slot[0x10].type = '\x01';
    opll->slot[0x10].eg_mode = 7;
    opll->slot[0x11].eg_mode = 7;
    opll->slot[0x10].patch = opll->patch + 0x24;
    pEVar3 = opll->patch + 0x25;
  }
  else {
    if (opll->slot_on_flag[0x11] == '\0') {
      bVar4 = false;
    }
    else {
      bVar4 = opll->slot_on_flag[0x10] != '\0';
    }
    if ((opll->reg[0xe] & 0x20) != 0 || bVar4) {
      return;
    }
    opll->slot[0x10].type = '\0';
    opll->slot[0x10].eg_mode = 7;
    opll->slot[0x11].eg_mode = 7;
    bVar1 = opll->reg[0x38] >> 4;
    opll->patch_number[8] = bVar1;
    uVar2 = (uint)bVar1 * 2;
    opll->slot[0x10].patch = opll->patch + uVar2;
    pEVar3 = opll->patch + (byte)((char)uVar2 + 1);
  }
  opll->slot[0x11].patch = pEVar3;
  return;
}

Assistant:

INLINE void
update_rhythm_mode (EOPLL * opll)
{
  if (opll->patch_number[6] & 0x10)
  {
    if (!(opll->slot_on_flag[SLOT_BD2] | (opll->reg[0x0e] & 32)))
    {
      opll->slot[SLOT_BD1].eg_mode = FINISH;
      opll->slot[SLOT_BD2].eg_mode = FINISH;
      setPatch (opll, 6, opll->reg[0x36] >> 4);
    }
  }
  else if (opll->reg[0x0e] & 32)
  {
    opll->patch_number[6] = 16;
    opll->slot[SLOT_BD1].eg_mode = FINISH;
    opll->slot[SLOT_BD2].eg_mode = FINISH;
    setSlotPatch (&opll->slot[SLOT_BD1], &opll->patch[16 * 2 + 0]);
    setSlotPatch (&opll->slot[SLOT_BD2], &opll->patch[16 * 2 + 1]);
  }

  if (opll->patch_number[7] & 0x10)
  {
    if (!((opll->slot_on_flag[SLOT_HH] && opll->slot_on_flag[SLOT_SD]) | (opll->reg[0x0e] & 32)))
    {
      opll->slot[SLOT_HH].type = 0;
      opll->slot[SLOT_HH].eg_mode = FINISH;
      opll->slot[SLOT_SD].eg_mode = FINISH;
      setPatch (opll, 7, opll->reg[0x37] >> 4);
    }
  }
  else if (opll->reg[0x0e] & 32)
  {
    opll->patch_number[7] = 17;
    opll->slot[SLOT_HH].type = 1;
    opll->slot[SLOT_HH].eg_mode = FINISH;
    opll->slot[SLOT_SD].eg_mode = FINISH;
    setSlotPatch (&opll->slot[SLOT_HH], &opll->patch[17 * 2 + 0]);
    setSlotPatch (&opll->slot[SLOT_SD], &opll->patch[17 * 2 + 1]);
  }

  if (opll->patch_number[8] & 0x10)
  {
    if (!((opll->slot_on_flag[SLOT_CYM] && opll->slot_on_flag[SLOT_TOM]) | (opll->reg[0x0e] & 32)))
    {
      opll->slot[SLOT_TOM].type = 0;
      opll->slot[SLOT_TOM].eg_mode = FINISH;
      opll->slot[SLOT_CYM].eg_mode = FINISH;
      setPatch (opll, 8, opll->reg[0x38] >> 4);
    }
  }
  else if (opll->reg[0x0e] & 32)
  {
    opll->patch_number[8] = 18;
    opll->slot[SLOT_TOM].type = 1;
    opll->slot[SLOT_TOM].eg_mode = FINISH;
    opll->slot[SLOT_CYM].eg_mode = FINISH;
    setSlotPatch (&opll->slot[SLOT_TOM], &opll->patch[18 * 2 + 0]);
    setSlotPatch (&opll->slot[SLOT_CYM], &opll->patch[18 * 2 + 1]);
  }
}